

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTGame.cpp
# Opt level: O2

TTTGame * __thiscall TTTGame::operator=(TTTGame *this,TTTGame *rhs)

{
  if (rhs != this) {
    Player::operator=(&this->m_player1,&rhs->m_player1);
    Player::operator=(&this->m_player2,&rhs->m_player2);
    std::__cxx11::string::_M_assign((string *)&this->m_name);
  }
  return this;
}

Assistant:

TTTGame *TTTGame::operator=(const TTTGame & rhs)
{
    if(&rhs != this)
    {
        m_player1 = rhs.m_player1;
        m_player2 = rhs.m_player2;
        m_name = rhs.m_name;
    }

    return this;
}